

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearDecayCorrelationModel.cpp
# Opt level: O2

void __thiscall
csm::LinearDecayCorrelationModel::setCorrelationGroupParameters
          (LinearDecayCorrelationModel *this,size_t cpGroupIndex,Parameters *params)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  Error *pEVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  allocator<char> local_66;
  allocator<char> local_65;
  ErrorType local_64;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"setCorrelationGroupParameters",(allocator<char> *)&local_40);
  checkParameterGroupIndex(this,cpGroupIndex,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pdVar2 = (params->theInitialCorrsPerSegment).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(params->theInitialCorrsPerSegment).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pdVar2;
  pdVar3 = (params->theTimesPerSegment).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar5 != (long)(params->theTimesPerSegment).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar3) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x50);
    local_64 = BOUNDS;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Must have equal number of correlations and times.",&local_65);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"csm::LinearDecayCorrelationModel::setCorrelationGroupParameters"
               ,&local_66);
    Error::Error(pEVar4,&local_64,&local_60,&local_40);
    __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
  }
  uVar6 = lVar5 >> 3;
  if (1 < uVar6) {
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      dVar1 = pdVar2[uVar7];
      if ((dVar1 < 0.0) || (1.0 < dVar1)) {
        pEVar4 = (Error *)__cxa_allocate_exception(0x50);
        local_64 = BOUNDS;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"Correlation must be in range [0..1].",&local_65);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,
                   "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters",&local_66);
        Error::Error(pEVar4,&local_64,&local_60,&local_40);
        __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
      }
      if (uVar7 != 0) {
        if (pdVar2[uVar7 - 1] <= dVar1 && dVar1 != pdVar2[uVar7 - 1]) {
          pEVar4 = (Error *)__cxa_allocate_exception(0x50);
          local_64 = BOUNDS;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,"Correlation must be monotomically decreasing.",&local_65);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,
                     "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters",&local_66);
          Error::Error(pEVar4,&local_64,&local_60,&local_40);
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        if (pdVar3[uVar7] <= pdVar3[uVar7 - 1] && pdVar3[uVar7 - 1] != pdVar3[uVar7]) {
          pEVar4 = (Error *)__cxa_allocate_exception(0x50);
          local_64 = BOUNDS;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,"Time must be monotomically increasing.",&local_65);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,
                     "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters",&local_66);
          Error::Error(pEVar4,&local_64,&local_60,&local_40);
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
      }
    }
  }
  Parameters::operator=
            ((this->theCorrParams).
             super__Vector_base<csm::LinearDecayCorrelationModel::Parameters,_std::allocator<csm::LinearDecayCorrelationModel::Parameters>_>
             ._M_impl.super__Vector_impl_data._M_start + cpGroupIndex,params);
  return;
}

Assistant:

void LinearDecayCorrelationModel::setCorrelationGroupParameters(
   size_t            cpGroupIndex,
   const Parameters& params)
{
   static const char* const MODULE =
      "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters";

   // make sure the index falls within the acceptable range
   checkParameterGroupIndex(cpGroupIndex, "setCorrelationGroupParameters");

   // make sure the values of each correlation model parameter
   // fall within acceptable ranges
   size_t size = params.theInitialCorrsPerSegment.size();
   if (size != params.theTimesPerSegment.size())
   {
      throw Error(
         Error::BOUNDS,
         "Must have equal number of correlations and times.",
         MODULE);
   }

   double corr, prevCorr;
   double time, prevTime;

   if (size > 1)
   {
      for(size_t i = 0; i < size; ++i)
      {
         corr = params.theInitialCorrsPerSegment[i];
         time = params.theTimesPerSegment[i];
         if (corr < 0.0 || corr > 1.0)
         {
            throw Error(
               Error::BOUNDS,
               "Correlation must be in range [0..1].",
               MODULE);
         }

         if (i > 0)
         {
            prevCorr = params.theInitialCorrsPerSegment[i-1];
            prevTime = params.theTimesPerSegment[i-1];
            if (corr > prevCorr)
            {
               throw Error(
                  Error::BOUNDS,
                  "Correlation must be monotomically decreasing.",
                  MODULE);
            }
            if (time < prevTime)
            {
               throw Error(
                  Error::BOUNDS,
                  "Time must be monotomically increasing.",
                  MODULE);
            }
         }
      }
   }

   // store the correlation parameter values
   theCorrParams[cpGroupIndex] = params;
}